

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

coeff_buf * __thiscall
jpgd::jpeg_decoder::coeff_buf_open
          (jpeg_decoder *this,int block_num_x,int block_num_y,int block_len_x,int block_len_y)

{
  coeff_buf *pcVar1;
  uint8 *puVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  coeff_buf *cb;
  
  pcVar1 = (coeff_buf *)alloc(this,CONCAT44(block_num_x,block_num_y),block_len_x._3_1_);
  pcVar1->block_num_x = in_ESI;
  pcVar1->block_num_y = in_EDX;
  pcVar1->block_len_x = in_ECX;
  pcVar1->block_len_y = in_R8D;
  pcVar1->block_size = in_ECX * in_R8D * 2;
  puVar2 = (uint8 *)alloc(this,CONCAT44(block_num_x,block_num_y),block_len_x._3_1_);
  pcVar1->pData = puVar2;
  return pcVar1;
}

Assistant:

jpeg_decoder::coeff_buf* jpeg_decoder::coeff_buf_open(int block_num_x, int block_num_y, int block_len_x, int block_len_y)
	{
		coeff_buf* cb = (coeff_buf*)alloc(sizeof(coeff_buf));

		cb->block_num_x = block_num_x;
		cb->block_num_y = block_num_y;
		cb->block_len_x = block_len_x;
		cb->block_len_y = block_len_y;
		cb->block_size = (block_len_x * block_len_y) * sizeof(jpgd_block_t);
		cb->pData = (uint8*)alloc(cb->block_size * block_num_x * block_num_y, true);
		return cb;
	}